

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

char * serial_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int iVar1;
  Serial *serial_00;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  char *line;
  char *err;
  Serial *serial;
  _Bool keepalive_local;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *vt_local;
  
  seat_set_trust_status(seat,false);
  serial_00 = (Serial *)safemalloc(1,0x58,0);
  memset(serial_00,0,0x58);
  (serial_00->backend).vt = vt;
  *backend_handle = &serial_00->backend;
  serial_00->seat = seat;
  serial_00->logctx = logctx;
  serial_00->finished = false;
  serial_00->inbufsize = 0;
  bufchain_init(&serial_00->output_data);
  pcVar2 = conf_get_str(conf,0x3e);
  logeventf(serial_00->logctx,"Opening serial device %s",pcVar2);
  iVar1 = open(pcVar2,0x902);
  serial_00->fd = iVar1;
  if (serial_00->fd < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    vt_local = (BackendVtable *)dupprintf("Opening serial port \'%s\': %s",pcVar2,pcVar4);
  }
  else {
    cloexec(serial_00->fd);
    vt_local = (BackendVtable *)serial_configure(serial_00,conf);
    if (vt_local == (BackendVtable *)0x0) {
      pcVar2 = dupstr(pcVar2);
      *realhost = pcVar2;
      if (serial_by_fd == (tree234 *)0x0) {
        serial_by_fd = newtree234(serial_compare_by_fd);
      }
      add234(serial_by_fd,serial_00);
      serial_uxsel_setup(serial_00);
      seat_update_specials_menu(serial_00->seat);
      vt_local = (BackendVtable *)0x0;
    }
  }
  return (char *)vt_local;
}

Assistant:

static char *serial_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    Serial *serial;
    char *err;
    char *line;

    /* No local authentication phase in this protocol */
    seat_set_trust_status(seat, false);

    serial = snew(Serial);
    memset(serial, 0, sizeof(Serial));
    serial->backend.vt = vt;
    *backend_handle = &serial->backend;

    serial->seat = seat;
    serial->logctx = logctx;
    serial->finished = false;
    serial->inbufsize = 0;
    bufchain_init(&serial->output_data);

    line = conf_get_str(conf, CONF_serline);
    logeventf(serial->logctx, "Opening serial device %s", line);

    serial->fd = open(line, O_RDWR | O_NOCTTY | O_NDELAY | O_NONBLOCK);
    if (serial->fd < 0)
        return dupprintf("Opening serial port '%s': %s",
                         line, strerror(errno));

    cloexec(serial->fd);

    err = serial_configure(serial, conf);
    if (err)
        return err;

    *realhost = dupstr(line);

    if (!serial_by_fd)
        serial_by_fd = newtree234(serial_compare_by_fd);
    add234(serial_by_fd, serial);

    serial_uxsel_setup(serial);

    /*
     * Specials are always available.
     */
    seat_update_specials_menu(serial->seat);

    return NULL;
}